

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O3

int32 model_def_free(model_def_t *mdef)

{
  uint uVar1;
  ci_acmod_t *ptr;
  char **ppcVar2;
  acmod_t *ptr_00;
  itree_t **ptr_01;
  char *pcVar3;
  ulong uVar4;
  acmod_set_t *ptr_02;
  ulong uVar5;
  
  ptr_02 = mdef->acmod_set;
  if (ptr_02 == (acmod_set_t *)0x0) {
    ptr_02 = (acmod_set_t *)0x0;
  }
  else {
    ptr = ptr_02->ci;
    if (ptr != (ci_acmod_t *)0x0) {
      if (ptr_02->n_ci != 0) {
        uVar5 = 0;
        do {
          ckd_free(ptr_02->ci[uVar5].name);
          ptr_02 = mdef->acmod_set;
          ppcVar2 = ptr_02->ci[uVar5].attrib;
          if (ppcVar2 != (char **)0x0) {
            pcVar3 = *ppcVar2;
            if (pcVar3 != (char *)0x0) {
              uVar4 = 1;
              do {
                ckd_free(pcVar3);
                ppcVar2 = mdef->acmod_set->ci[uVar5].attrib;
                pcVar3 = ppcVar2[uVar4];
                uVar4 = (ulong)((int)uVar4 + 1);
              } while (pcVar3 != (char *)0x0);
            }
            ckd_free(ppcVar2);
            ptr_02 = mdef->acmod_set;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < ptr_02->n_ci);
        ptr = ptr_02->ci;
      }
      ckd_free(ptr);
      ptr_02 = mdef->acmod_set;
    }
    ptr_02->ci = (ci_acmod_t *)0x0;
    ptr_00 = ptr_02->multi;
    if (ptr_00 != (acmod_t *)0x0) {
      if (ptr_02->n_multi != 0) {
        uVar5 = 0;
        do {
          ppcVar2 = ptr_02->multi[uVar5].attrib;
          if (ppcVar2 != (char **)0x0) {
            pcVar3 = *ppcVar2;
            if (pcVar3 != (char *)0x0) {
              uVar4 = 1;
              do {
                ckd_free(pcVar3);
                ppcVar2 = mdef->acmod_set->multi[uVar5].attrib;
                pcVar3 = ppcVar2[uVar4];
                uVar4 = (ulong)((int)uVar4 + 1);
              } while (pcVar3 != (char *)0x0);
            }
            ckd_free(ppcVar2);
            ptr_02 = mdef->acmod_set;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < ptr_02->n_multi);
        ptr_00 = ptr_02->multi;
      }
      ckd_free(ptr_00);
      ptr_02 = mdef->acmod_set;
    }
    ptr_02->multi = (acmod_t *)0x0;
    ptr_01 = ptr_02->multi_idx;
    if (ptr_01 != (itree_t **)0x0) {
      if (ptr_02->n_ci != 0) {
        uVar5 = 0;
        do {
          ckd_free(ptr_02->multi_idx[uVar5]->cell);
          ckd_free(mdef->acmod_set->multi_idx[uVar5]);
          uVar5 = uVar5 + 1;
          ptr_02 = mdef->acmod_set;
        } while (uVar5 < ptr_02->n_ci);
        ptr_01 = ptr_02->multi_idx;
      }
      ckd_free(ptr_01);
      ptr_02 = mdef->acmod_set;
    }
    ptr_02->multi_idx = (itree_t **)0x0;
    ppcVar2 = ptr_02->attrib;
    if (ppcVar2 != (char **)0x0) {
      pcVar3 = *ppcVar2;
      if (pcVar3 != (char *)0x0) {
        uVar5 = 1;
        do {
          ckd_free(pcVar3);
          ppcVar2 = mdef->acmod_set->attrib;
          pcVar3 = ppcVar2[uVar5];
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (pcVar3 != (char *)0x0);
      }
      ckd_free(ppcVar2);
      ptr_02 = mdef->acmod_set;
    }
    ptr_02->attrib = (char **)0x0;
    if (ptr_02->n_with != (uint32 *)0x0) {
      ckd_free(ptr_02->n_with);
      ptr_02 = mdef->acmod_set;
    }
    ptr_02->n_with = (uint32 *)0x0;
  }
  ckd_free(ptr_02);
  mdef->acmod_set = (acmod_set_t *)0x0;
  if (mdef->defn != (model_def_entry_t *)0x0) {
    ckd_free(mdef->defn->state);
    uVar1 = mdef->n_defn;
    if (uVar1 != 0) {
      uVar5 = 0;
      do {
        ppcVar2 = mdef->defn[uVar5].attrib;
        if (ppcVar2 != (char **)0x0) {
          pcVar3 = *ppcVar2;
          if (pcVar3 != (char *)0x0) {
            uVar4 = 1;
            do {
              ckd_free(pcVar3);
              ppcVar2 = mdef->defn[uVar5].attrib;
              pcVar3 = ppcVar2[uVar4];
              uVar4 = (ulong)((int)uVar4 + 1);
            } while (pcVar3 != (char *)0x0);
          }
          ckd_free(ppcVar2);
          uVar1 = mdef->n_defn;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar1);
    }
  }
  ckd_free(mdef->defn);
  mdef->defn = (model_def_entry_t *)0x0;
  if (mdef->cb != (uint32 *)0x0) {
    ckd_free(mdef->cb);
  }
  mdef->cb = (uint32 *)0x0;
  if (mdef->ts2ci != (acmod_id_t *)0x0) {
    ckd_free(mdef->ts2ci);
  }
  mdef->ts2ci = (acmod_id_t *)0x0;
  ckd_free(mdef);
  return 0;
}

Assistant:

int32
model_def_free(model_def_t *mdef)
{
  uint32 i;
  uint32 len;

  if (mdef->acmod_set) {
    if (mdef->acmod_set->ci) {
      for (i = 0; i < mdef->acmod_set->n_ci; i++) {
	ckd_free(mdef->acmod_set->ci[i].name);
	if (mdef->acmod_set->ci[i].attrib) {
	  for (len = 0; mdef->acmod_set->ci[i].attrib[len]; len++)
    	     ckd_free(mdef->acmod_set->ci[i].attrib[len]);
	  ckd_free(mdef->acmod_set->ci[i].attrib);
	}
      }
      ckd_free(mdef->acmod_set->ci);
    }
    mdef->acmod_set->ci = NULL;

    if (mdef->acmod_set->multi) {
      for (i = 0; i < mdef->acmod_set->n_multi; i ++) {
	if (mdef->acmod_set->multi[i].attrib) {
	  for (len = 0; mdef->acmod_set->multi[i].attrib[len]; len++)
	     ckd_free(mdef->acmod_set->multi[i].attrib[len]);
	  ckd_free(mdef->acmod_set->multi[i].attrib);
	}
      }
      ckd_free(mdef->acmod_set->multi);
    }
    mdef->acmod_set->multi = NULL;

    if (mdef->acmod_set->multi_idx) {
      for (i = 0; i < mdef->acmod_set->n_ci; i++) {
	ckd_free(mdef->acmod_set->multi_idx[i]->cell);
	ckd_free(mdef->acmod_set->multi_idx[i]);
      }
      ckd_free(mdef->acmod_set->multi_idx);
    }
    mdef->acmod_set->multi_idx = NULL;

    if (mdef->acmod_set->attrib) {
      for (len = 0; mdef->acmod_set->attrib[len]; len++)
	  ckd_free(mdef->acmod_set->attrib[len]);
      ckd_free(mdef->acmod_set->attrib);
    }
    mdef->acmod_set->attrib = NULL;

    if (mdef->acmod_set->n_with)
      ckd_free(mdef->acmod_set->n_with);
    mdef->acmod_set->n_with = NULL;
  }
  ckd_free(mdef->acmod_set);
  mdef->acmod_set = NULL;

  if (mdef->defn) {
    ckd_free(mdef->defn->state);
    for (i = 0; i < mdef->n_defn; i++) {
      if (mdef->defn[i].attrib) {
	for (len = 0; mdef->defn[i].attrib[len]; len++)
	    ckd_free(mdef->defn[i].attrib[len]);
	ckd_free(mdef->defn[i].attrib);
      }
    }
  }
  ckd_free(mdef->defn);
  mdef->defn = NULL;

  if (mdef->cb)
    ckd_free(mdef->cb);
  mdef->cb = NULL;

  if (mdef->ts2ci)
    ckd_free(mdef->ts2ci);
  mdef->ts2ci = NULL;

  ckd_free(mdef);
  mdef = NULL;

  return S3_SUCCESS;
}